

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_resolver.cc
# Opt level: O2

Status __thiscall
google::protobuf::anon_unknown_21::ValidateDescriptor(anon_unknown_21 *this,Descriptor *descriptor)

{
  ushort uVar1;
  uint uVar2;
  bool bVar3;
  FieldDescriptor *this_00;
  void **ppvVar4;
  const_iterator cVar5;
  EnumDescriptor *pEVar6;
  EnumValueDescriptor *pEVar7;
  ulong *puVar8;
  char *pcVar9;
  pointer args_2;
  char *pcVar10;
  int index;
  int index_00;
  char *pcVar11;
  undefined1 *from_msg;
  ulong uVar12;
  Edition args_3;
  char *in_R9;
  undefined1 *puVar13;
  RepeatedPtrField<google::protobuf::FieldOptions_EditionDefault> *pRVar14;
  basic_string_view<char,_std::char_traits<char>_> args_1;
  basic_string_view<char,_std::char_traits<char>_> args_1_00;
  string_view full_name;
  basic_string_view<char,_std::char_traits<char>_> args_1_01;
  string_view full_name_00;
  basic_string_view<char,_std::char_traits<char>_> args_1_02;
  basic_string_view<char,_std::char_traits<char>_> args_3_00;
  FeatureSupport support;
  FieldOptions_FeatureSupport local_90;
  ulong local_60 [6];
  
  if (descriptor->oneof_decl_count_ < 1) {
    for (index_00 = 0; index_00 < descriptor->field_count_; index_00 = index_00 + 1) {
      this_00 = Descriptor::field(descriptor,index_00);
      bVar3 = FieldDescriptor::is_required(this_00);
      if (bVar3) {
        pcVar9 = (this_00->all_names_).payload_;
        pcVar10 = (char *)(ulong)*(ushort *)(pcVar9 + 2);
        pcVar9 = pcVar9 + ~(ulong)pcVar10;
        pcVar11 = "Feature field ";
        goto LAB_0020ba25;
      }
      bVar3 = FieldDescriptor::is_repeated(this_00);
      if (bVar3) {
        pcVar9 = (this_00->all_names_).payload_;
        pcVar10 = (char *)(ulong)*(ushort *)(pcVar9 + 2);
        pcVar9 = pcVar9 + ~(ulong)pcVar10;
        pcVar11 = "Feature field ";
        goto LAB_0020ba25;
      }
      if ((this_00->type_ != '\b') && (this_00->type_ != '\x0e')) {
        pcVar9 = (this_00->all_names_).payload_;
        pcVar10 = (char *)(ulong)*(ushort *)(pcVar9 + 2);
        pcVar9 = pcVar9 + ~(ulong)pcVar10;
        pcVar11 = "Feature field ";
        goto LAB_0020ba25;
      }
      bVar3 = RepeatedField<int>::empty(&(this_00->options_->field_0)._impl_.targets_);
      if (bVar3) {
        pcVar9 = (this_00->all_names_).payload_;
        pcVar10 = (char *)(ulong)*(ushort *)(pcVar9 + 2);
        pcVar9 = pcVar9 + ~(ulong)pcVar10;
        pcVar11 = "Feature field ";
        goto LAB_0020ba25;
      }
      pRVar14 = &(this_00->options_->field_0)._impl_.edition_defaults_;
      ppvVar4 = internal::RepeatedPtrFieldBase::elements(&pRVar14->super_RepeatedPtrFieldBase);
      cVar5 = RepeatedPtrField<google::protobuf::FieldOptions_EditionDefault>::end(pRVar14);
      bVar3 = false;
      for (; ppvVar4 != cVar5.it_; ppvVar4 = ppvVar4 + 1) {
        bVar3 = (bool)(bVar3 | *(int *)((long)*ppvVar4 + 0x20) == 900);
      }
      if (!bVar3) {
        pcVar9 = (this_00->all_names_).payload_;
        pcVar10 = (char *)(ulong)*(ushort *)(pcVar9 + 2);
        pcVar9 = pcVar9 + ~(ulong)pcVar10;
        pcVar11 = "Feature field ";
        goto LAB_0020ba25;
      }
      bVar3 = FieldOptions::has_feature_support(this_00->options_);
      if (bVar3) {
        puVar13 = (undefined1 *)(this_00->options_->field_0)._impl_.feature_support_;
        if ((FieldOptions_FeatureSupport *)puVar13 == (FieldOptions_FeatureSupport *)0x0) {
          puVar13 = _FieldOptions_FeatureSupport_default_instance_;
        }
        pcVar9 = (this_00->all_names_).payload_;
        uVar1 = *(ushort *)(pcVar9 + 2);
        pcVar10 = (char *)(ulong)uVar1;
        pcVar9 = pcVar9 + ~(ulong)pcVar10;
        if ((undefined1  [32])
            ((undefined1  [32])((FieldOptions_FeatureSupport *)puVar13)->field_0 &
            (undefined1  [32])0x2) == (undefined1  [32])0x0) goto LAB_0020bb64;
        full_name_00._M_str._0_2_ = uVar1;
        full_name_00._M_len = (size_t)puVar13;
        full_name_00._M_str._2_6_ = 0;
        ValidateFeatureSupport((FeatureSupport *)this,full_name_00);
        if (*(long *)this != 1) {
          return (Status)(uintptr_t)this;
        }
        absl::lts_20250127::Status::~Status((Status *)this);
        pRVar14 = &(this_00->options_->field_0)._impl_.edition_defaults_;
        ppvVar4 = internal::RepeatedPtrFieldBase::elements(&pRVar14->super_RepeatedPtrFieldBase);
        cVar5 = RepeatedPtrField<google::protobuf::FieldOptions_EditionDefault>::end(pRVar14);
        for (; ppvVar4 != cVar5.it_; ppvVar4 = ppvVar4 + 1) {
          uVar2 = *(uint *)((long)*ppvVar4 + 0x20);
          if (999 < (int)uVar2) {
            if ((int)uVar2 <
                (((FieldOptions_FeatureSupport *)puVar13)->field_0)._impl_.edition_introduced_) {
              pcVar9 = (this_00->all_names_).payload_;
              uVar12 = (ulong)*(ushort *)(pcVar9 + 2);
              pcVar9 = pcVar9 + ~uVar12;
              args_3 = 0x3ea8f6;
            }
            else {
              if (((undefined1  [32])
                   ((undefined1  [32])((FieldOptions_FeatureSupport *)puVar13)->field_0 &
                   (undefined1  [32])0x8) == (undefined1  [32])0x0) ||
                 ((int)uVar2 <=
                  (((FieldOptions_FeatureSupport *)puVar13)->field_0)._impl_.edition_removed_))
              goto LAB_0020bdb5;
              pcVar9 = (this_00->all_names_).payload_;
              uVar12 = (ulong)*(ushort *)(pcVar9 + 2);
              pcVar9 = pcVar9 + ~uVar12;
              args_3 = 0x3ea98f;
            }
            args_1_02._M_str = pcVar9;
            args_1_02._M_len = uVar12;
            protobuf::(anonymous_namespace)::
            Error<char_const*,std::basic_string_view<char,std::char_traits<char>>,char_const*,google::protobuf::Edition,char_const*>
                      ((char *)this,args_1_02,(char *)(ulong)uVar2,args_3,in_R9);
            goto LAB_0020bb69;
          }
LAB_0020bdb5:
        }
        *(undefined8 *)this = 1;
      }
      else {
        pcVar9 = (this_00->all_names_).payload_;
        pcVar10 = (char *)(ulong)*(ushort *)(pcVar9 + 2);
        pcVar9 = pcVar9 + ~(ulong)pcVar10;
LAB_0020bb64:
        args_1_00._M_str = pcVar10;
        args_1_00._M_len = (size_t)"Feature field ";
        protobuf::(anonymous_namespace)::
        Error<char_const*,std::basic_string_view<char,std::char_traits<char>>,char_const*>
                  ((char *)this,args_1_00,pcVar9);
LAB_0020bb69:
        if (*(long *)this != 1) {
          return (Status)(uintptr_t)this;
        }
      }
      absl::lts_20250127::Status::~Status((Status *)this);
      pEVar6 = FieldDescriptor::enum_type(this_00);
      if (pEVar6 != (EnumDescriptor *)0x0) {
        pEVar6 = FieldDescriptor::enum_type(this_00);
        if (pEVar6 == (EnumDescriptor *)0x0) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_90,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/feature_resolver.cc"
                     ,0x9f,"field.enum_type() != nullptr");
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)&local_90);
        }
        puVar13 = (undefined1 *)(this_00->options_->field_0)._impl_.feature_support_;
        if ((FieldOptions_FeatureSupport *)puVar13 == (FieldOptions_FeatureSupport *)0x0) {
          puVar13 = _FieldOptions_FeatureSupport_default_instance_;
        }
        for (index = 0; pEVar6 = FieldDescriptor::enum_type(this_00), index < pEVar6->value_count_;
            index = index + 1) {
          pEVar6 = FieldDescriptor::enum_type(this_00);
          pEVar7 = EnumDescriptor::value(pEVar6,index);
          pcVar9 = (this_00->all_names_).payload_;
          uVar12 = (ulong)*(ushort *)(pcVar9 + 2);
          bVar3 = EnumValueOptions::has_feature_support(pEVar7->options_);
          if (bVar3) {
            FieldOptions_FeatureSupport::FieldOptions_FeatureSupport
                      (&local_90,(FieldOptions_FeatureSupport *)puVar13);
            from_msg = (undefined1 *)(pEVar7->options_->field_0)._impl_.feature_support_;
            if ((FieldOptions_FeatureSupport *)from_msg == (FieldOptions_FeatureSupport *)0x0) {
              from_msg = _FieldOptions_FeatureSupport_default_instance_;
            }
            FieldOptions_FeatureSupport::MergeImpl((MessageLite *)&local_90,(MessageLite *)from_msg)
            ;
            full_name._M_str = (char *)pEVar7->all_names_[1]._M_string_length;
            full_name._M_len = (size_t)&local_90;
            ValidateFeatureSupport((FeatureSupport *)this,full_name);
            if (*(long *)this == 1) {
              absl::lts_20250127::Status::~Status((Status *)this);
              if ((int)local_90.field_0._16_4_ <
                  (((FieldOptions_FeatureSupport *)puVar13)->field_0)._impl_.edition_introduced_) {
                args_2 = pEVar7->all_names_[1]._M_dataplus._M_p;
                pcVar10 = (char *)pEVar7->all_names_[1]._M_string_length;
                local_60[4] = uVar12;
                puVar8 = local_60 + 4;
                pcVar11 = " was introduced before feature ";
              }
              else if ((((undefined1  [32])((FieldOptions_FeatureSupport *)puVar13)->field_0 &
                        (undefined1  [32])0x8) == (undefined1  [32])0x0) ||
                      (local_90.field_0._impl_.edition_removed_ <=
                       (((FieldOptions_FeatureSupport *)puVar13)->field_0)._impl_.edition_removed_))
              {
                if ((((undefined1  [32])((FieldOptions_FeatureSupport *)puVar13)->field_0 &
                     (undefined1  [32])0x4) == (undefined1  [32])0x0) ||
                   (local_90.field_0._impl_.edition_deprecated_ <=
                    (((FieldOptions_FeatureSupport *)puVar13)->field_0)._impl_.edition_deprecated_))
                {
                  *(undefined8 *)this = 1;
                  goto LAB_0020bd14;
                }
                args_2 = pEVar7->all_names_[1]._M_dataplus._M_p;
                pcVar10 = (char *)pEVar7->all_names_[1]._M_string_length;
                local_60[0] = uVar12;
                puVar8 = local_60;
                pcVar11 = " was deprecated after feature ";
              }
              else {
                args_2 = pEVar7->all_names_[1]._M_dataplus._M_p;
                pcVar10 = (char *)pEVar7->all_names_[1]._M_string_length;
                local_60[2] = uVar12;
                puVar8 = local_60 + 2;
                pcVar11 = " was removed after feature ";
              }
              puVar8[1] = (ulong)(pcVar9 + ~uVar12);
              args_1_01._M_str = pcVar10;
              args_1_01._M_len = (size_t)"Feature value ";
              args_3_00._M_str = " was.";
              args_3_00._M_len = (size_t)pcVar11;
              in_R9 = " was.";
              protobuf::(anonymous_namespace)::
              Error<char_const*,std::basic_string_view<char,std::char_traits<char>>,char_const*,std::basic_string_view<char,std::char_traits<char>>,char_const*>
                        ((char *)this,args_1_01,args_2,args_3_00,(char *)*puVar8);
            }
LAB_0020bd14:
            FieldOptions_FeatureSupport::~FieldOptions_FeatureSupport(&local_90);
            if (*(long *)this != 1) {
              return (Status)(uintptr_t)this;
            }
          }
          else {
            *(undefined8 *)this = 1;
          }
          absl::lts_20250127::Status::~Status((Status *)this);
        }
        *(undefined8 *)this = 1;
        absl::lts_20250127::Status::~Status((Status *)this);
      }
    }
    *(undefined8 *)this = 1;
  }
  else {
    pcVar9 = (descriptor->all_names_).payload_;
    pcVar10 = (char *)(ulong)*(ushort *)(pcVar9 + 2);
    pcVar9 = pcVar9 + ~(ulong)pcVar10;
    pcVar11 = "Type ";
LAB_0020ba25:
    args_1._M_str = pcVar10;
    args_1._M_len = (size_t)pcVar11;
    protobuf::(anonymous_namespace)::
    Error<char_const*,std::basic_string_view<char,std::char_traits<char>>,char_const*>
              ((char *)this,args_1,pcVar9);
  }
  return (Status)(uintptr_t)this;
}

Assistant:

absl::Status ValidateDescriptor(const Descriptor& descriptor) {
  if (descriptor.oneof_decl_count() > 0) {
    return Error("Type ", descriptor.full_name(),
                 " contains unsupported oneof feature fields.");
  }
  for (int i = 0; i < descriptor.field_count(); ++i) {
    const FieldDescriptor& field = *descriptor.field(i);

    if (field.is_required()) {
      return Error("Feature field ", field.full_name(),
                   " is an unsupported required field.");
    }
    if (field.is_repeated()) {
      return Error("Feature field ", field.full_name(),
                   " is an unsupported repeated field.");
    }
    if (field.type() != FieldDescriptor::TYPE_ENUM &&
        field.type() != FieldDescriptor::TYPE_BOOL) {
      return Error("Feature field ", field.full_name(),
                   " is not an enum or boolean.");
    }
    if (field.options().targets().empty()) {
      return Error("Feature field ", field.full_name(),
                   " has no target specified.");
    }

    bool has_legacy_default = false;
    for (const auto& d : field.options().edition_defaults()) {
      if (d.edition() == Edition::EDITION_LEGACY) {
        has_legacy_default = true;
        continue;
      }
    }
    if (!has_legacy_default) {
      return Error("Feature field ", field.full_name(),
                   " has no default specified for EDITION_LEGACY, before it "
                   "was introduced.");
    }

    RETURN_IF_ERROR(ValidateFieldFeatureSupport(field));
    if (field.enum_type() != nullptr) {
      RETURN_IF_ERROR(ValidateValuesFeatureSupport(field));
    }
  }

  return absl::OkStatus();
}